

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

string_view __thiscall absl::lts_20240722::Cord::FlattenSlowPath(Cord *this)

{
  CordRep *this_00;
  CordRepFlat *pCVar1;
  uint8_t *dst;
  CordzInfo *info;
  Nonnull<absl::cord_internal::CordRep_*> rep;
  Nonnull<CordRepExternal_*> in_RCX;
  string_view data;
  string_view sVar2;
  new_allocator<char> local_29;
  CordzUpdateScope scope;
  
  if (((this->contents_).data_.rep_.field_0.data[0] & 1U) != 0) {
    sVar2._M_len = (cord_internal *)InlineRep::size(&this->contents_);
    if (sVar2._M_len < (cord_internal *)0xff4) {
      this_00 = &cord_internal::CordRepFlat::NewImpl<4096ul>((size_t)sVar2._M_len)->super_CordRep;
      this_00->length = (size_t)sVar2._M_len;
      pCVar1 = cord_internal::CordRep::flat(this_00);
      dst = (pCVar1->super_CordRep).storage;
      CopyToArraySlowPath(this,(Nonnull<char_*>)dst);
    }
    else {
      dst = (uint8_t *)
            __gnu_cxx::new_allocator<char>::allocate(&local_29,(size_type)sVar2._M_len,(void *)0x0);
      CopyToArraySlowPath(this,(Nonnull<char_*>)dst);
      this_00 = (CordRep *)operator_new(0x20);
      (this_00->refcount).count_.super___atomic_base<int>._M_i = 2;
      *(code **)&this_00[1].refcount =
           cord_internal::
           CordRepExternalImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/strings/cord.cc:1389:52)>
           ::Release;
      data._M_str = (char *)this_00;
      data._M_len = (size_t)dst;
      cord_internal::InitializeCordRepExternal(sVar2._M_len,data,in_RCX);
    }
    info = cord_internal::InlineData::cordz_info((InlineData *)this);
    cord_internal::CordzUpdateScope::CordzUpdateScope(&scope,info,kFlatten);
    rep = InlineRep::as_tree(&this->contents_);
    cord_internal::CordRep::Unref(rep);
    InlineRep::SetTree(&this->contents_,this_00,&scope);
    cord_internal::CordzUpdateScope::~CordzUpdateScope(&scope);
    sVar2._M_str = (char *)dst;
    return sVar2;
  }
  __assert_fail("contents_.is_tree()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/strings/cord.cc"
                ,0x55d,"absl::string_view absl::Cord::FlattenSlowPath()");
}

Assistant:

absl::string_view Cord::FlattenSlowPath() {
  assert(contents_.is_tree());
  size_t total_size = size();
  CordRep* new_rep;
  char* new_buffer;

  // Try to put the contents into a new flat rep. If they won't fit in the
  // biggest possible flat node, use an external rep instead.
  if (total_size <= kMaxFlatLength) {
    new_rep = CordRepFlat::New(total_size);
    new_rep->length = total_size;
    new_buffer = new_rep->flat()->Data();
    CopyToArraySlowPath(new_buffer);
  } else {
    new_buffer = std::allocator<char>().allocate(total_size);
    CopyToArraySlowPath(new_buffer);
    new_rep = absl::cord_internal::NewExternalRep(
        absl::string_view(new_buffer, total_size), [](absl::string_view s) {
          std::allocator<char>().deallocate(const_cast<char*>(s.data()),
                                            s.size());
        });
  }
  CordzUpdateScope scope(contents_.cordz_info(), CordzUpdateTracker::kFlatten);
  CordRep::Unref(contents_.as_tree());
  contents_.SetTree(new_rep, scope);
  return absl::string_view(new_buffer, total_size);
}